

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  bool bVar3;
  ImportInfo *pIVar4;
  char *__s;
  size_t sVar5;
  ManagedType MVar6;
  string local_40;
  
  TVar2 = this->Target->TargetTypeValue;
  MVar6 = Undefined;
  if (((int)TVar2 < 3) && (MVar6 = Native, TVar2 != STATIC_LIBRARY)) {
    if (this->Target->IsImportedTarget == true) {
      pIVar4 = GetImportInfo(this,config);
      MVar6 = Undefined;
      if (pIVar4 != (ImportInfo *)0x0) {
        MVar6 = pIVar4->Managed;
      }
    }
    else {
      paVar1 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"COMMON_LANGUAGE_RUNTIME","");
      __s = GetProperty(this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (__s == (char *)0x0) {
        bVar3 = IsCSharpOnly(this);
        MVar6 = (uint)bVar3 * 2 + Native;
      }
      else {
        local_40._M_dataplus._M_p = (pointer)paVar1;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar5);
        MVar6 = Managed - (local_40._M_string_length == 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return MVar6;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}